

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O0

int mg_rpc_create_reply(char *buf,int len,mg_rpc_request *req,char *result_fmt,...)

{
  char in_AL;
  int iVar1;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  json_token *local_110;
  undefined1 local_108 [32];
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  int local_4c;
  undefined1 local_48 [4];
  int n;
  va_list ap;
  json_token *id;
  char *result_fmt_local;
  mg_rpc_request *req_local;
  int len_local;
  char *buf_local;
  
  if (in_AL != '\0') {
    local_d8 = in_XMM0_Qa;
    local_c8 = in_XMM1_Qa;
    local_b8 = in_XMM2_Qa;
    local_a8 = in_XMM3_Qa;
    local_98 = in_XMM4_Qa;
    local_88 = in_XMM5_Qa;
    local_78 = in_XMM6_Qa;
    local_68 = in_XMM7_Qa;
  }
  if (req->id == (json_token *)0x0) {
    local_110 = &mg_rpc_create_reply::null_tok;
  }
  else {
    local_110 = req->id;
  }
  ap[0].reg_save_area = local_110;
  local_4c = 0;
  local_e8 = in_R8;
  local_e0 = in_R9;
  iVar1 = json_emit(buf,len,"{s:s,s:","jsonrpc","2.0","id");
  local_4c = iVar1 + local_4c;
  if (*(int *)((long)ap[0].reg_save_area + 0x10) == 1) {
    iVar1 = json_emit_quoted_str
                      (buf + local_4c,len - local_4c,*ap[0].reg_save_area,
                       *(int *)((long)ap[0].reg_save_area + 8));
    local_4c = iVar1 + local_4c;
  }
  else {
    iVar1 = json_emit_unquoted_str
                      (buf + local_4c,len - local_4c,*ap[0].reg_save_area,
                       *(int *)((long)ap[0].reg_save_area + 8));
    local_4c = iVar1 + local_4c;
  }
  iVar1 = json_emit(buf + local_4c,len - local_4c,",s:","result");
  local_4c = local_4c + iVar1;
  ap[0].overflow_arg_area = local_108;
  ap[0]._0_8_ = &stack0x00000008;
  n = 0x30;
  local_48 = (undefined1  [4])0x20;
  iVar1 = json_emit_va(buf + local_4c,len - local_4c,result_fmt,(__va_list_tag *)local_48);
  local_4c = local_4c + iVar1;
  iVar1 = json_emit(buf + local_4c,len - local_4c,"}");
  return local_4c + iVar1;
}

Assistant:

int mg_rpc_create_reply(char *buf, int len, const struct mg_rpc_request *req,
                        const char *result_fmt, ...) {
    static const struct json_token null_tok = {"null", 4, 0, JSON_TYPE_NULL};
    const struct json_token *id = req->id == NULL ? &null_tok : req->id;
    va_list ap;
    int n = 0;

    n += json_emit(buf + n, len - n, "{s:s,s:", "jsonrpc", "2.0", "id");
    if (id->type == JSON_TYPE_STRING) {
        n += json_emit_quoted_str(buf + n, len - n, id->ptr, id->len);
    } else {
        n += json_emit_unquoted_str(buf + n, len - n, id->ptr, id->len);
    }
    n += json_emit(buf + n, len - n, ",s:", "result");

    va_start(ap, result_fmt);
    n += json_emit_va(buf + n, len - n, result_fmt, ap);
    va_end(ap);

    n += json_emit(buf + n, len - n, "}");

    return n;
}